

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O0

bsc_step_t
bsc_exec_reduce(bsc_step_t depends,bsc_reduce_t reducer,void *a,void *a0,void *xs,bsc_size_t size)

{
  bsc_reduce_t local_68;
  exec_request_t r;
  request_t *req;
  bsc_size_t size_local;
  void *xs_local;
  void *a0_local;
  void *a_local;
  bsc_reduce_t reducer_local;
  bsc_step_t depends_local;
  
  local_68 = reducer;
  r.func = (bsc_reduce_t)a;
  r.a = a0;
  r.a0 = xs;
  r.xs._0_4_ = size;
  r._32_8_ = new_request(depends);
  ((request_t *)r._32_8_)->kind = EXEC;
  memcpy(&((request_t *)r._32_8_)->payload,&local_68,0x28);
  return depends + 1;
}

Assistant:

bsc_step_t bsc_exec_reduce( bsc_step_t depends, 
        bsc_reduce_t reducer, void * a, const void * a0,
        const void * xs, bsc_size_t size  )
{
    request_t * req;
    exec_request_t r;
    r.func = reducer;
    r.a= a;
    r.a0 = a0;
    r.xs = xs;
    r.size = size;
    
    req = new_request( depends );
    req->kind = EXEC;
    req->payload.exec = r;
    return depends + 1;
}